

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::objectivec::ImportWriter::ProtoFrameworkCollector::ConsumeLine
          (ProtoFrameworkCollector *this,StringPiece *line,string *out_error)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  stringpiece_ssize_type sVar1;
  iterator iVar2;
  ostream *poVar3;
  mapped_type *this_02;
  long lVar4;
  size_type n;
  size_type pos;
  int iVar5;
  int iVar6;
  StringPiece proto_file;
  StringPiece proto_file_list;
  string local_90;
  StringPiece framework_name;
  string local_50;
  
  iVar6 = 0;
  sVar1 = StringPiece::find(line,':',0);
  n = (size_type)(int)sVar1;
  if (n == 0xffffffffffffffff) {
    std::__cxx11::string::string
              ((string *)&framework_name,"Framework/proto file mapping line without colon sign: \'",
               (allocator *)&proto_file);
    StringPiece::ToString_abi_cxx11_((string *)&proto_file_list,line);
    std::operator+(&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &framework_name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &proto_file_list);
    std::operator+(&local_50,&local_90,"\'.");
    std::__cxx11::string::operator=((string *)out_error,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&proto_file_list);
    std::__cxx11::string::~string((string *)&framework_name);
  }
  else {
    framework_name = StringPiece::substr(line,0,n);
    proto_file_list =
         StringPiece::substr(line,(sVar1 << 0x20) + 0x100000000 >> 0x20,0xffffffffffffffff);
    lVar4 = proto_file_list.length_;
    TrimWhitespace(&framework_name);
    while (pos = (size_type)iVar6, (long)pos < lVar4) {
      sVar1 = StringPiece::find(&proto_file_list,',',pos);
      iVar5 = (int)sVar1;
      if ((int)sVar1 == -1) {
        iVar5 = (int)proto_file_list.length_;
      }
      proto_file = StringPiece::substr(&proto_file_list,pos,(long)(iVar5 - iVar6));
      TrimWhitespace(&proto_file);
      if (proto_file.length_ != 0) {
        this_00 = &this->map_->_M_t;
        StringPiece::ToString_abi_cxx11_(&local_50,&proto_file);
        iVar2 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(this_00,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        if ((_Rb_tree_header *)iVar2._M_node != &(this->map_->_M_t)._M_impl.super__Rb_tree_header) {
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "warning: duplicate proto file reference, replacing framework entry for \'"
                                  );
          StringPiece::ToString_abi_cxx11_(&local_50,&proto_file);
          poVar3 = std::operator<<(poVar3,(string *)&local_50);
          poVar3 = std::operator<<(poVar3,"\' with \'");
          StringPiece::ToString_abi_cxx11_(&local_90,&framework_name);
          poVar3 = std::operator<<(poVar3,(string *)&local_90);
          poVar3 = std::operator<<(poVar3,"\' (was \'");
          poVar3 = std::operator<<(poVar3,(string *)(iVar2._M_node + 2));
          poVar3 = std::operator<<(poVar3,"\').");
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_50);
          std::ostream::flush();
        }
        sVar1 = StringPiece::find(&proto_file,' ',0);
        if (sVar1 != -1) {
          poVar3 = std::operator<<((ostream *)&std::cerr,
                                   "note: framework mapping file had a proto file with a space in, hopefully that isn\'t a missing comma: \'"
                                  );
          StringPiece::ToString_abi_cxx11_(&local_50,&proto_file);
          poVar3 = std::operator<<(poVar3,(string *)&local_50);
          poVar3 = std::operator<<(poVar3,"\'");
          std::endl<char,std::char_traits<char>>(poVar3);
          std::__cxx11::string::~string((string *)&local_50);
          std::ostream::flush();
        }
        StringPiece::ToString_abi_cxx11_(&local_50,&framework_name);
        this_01 = this->map_;
        StringPiece::ToString_abi_cxx11_(&local_90,&proto_file);
        this_02 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](this_01,&local_90);
        std::__cxx11::string::operator=((string *)this_02,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_50);
      }
      lVar4 = proto_file_list.length_;
      iVar6 = iVar5 + 1;
    }
  }
  return n != 0xffffffffffffffff;
}

Assistant:

bool ImportWriter::ProtoFrameworkCollector::ConsumeLine(
    const StringPiece& line, string* out_error) {
  int offset = line.find(':');
  if (offset == StringPiece::npos) {
    *out_error =
        string("Framework/proto file mapping line without colon sign: '") +
        string(line) + "'.";
    return false;
  }
  StringPiece framework_name = line.substr(0, offset);
  StringPiece proto_file_list = line.substr(offset + 1);
  TrimWhitespace(&framework_name);

  int start = 0;
  while (start < proto_file_list.length()) {
    offset = proto_file_list.find(',', start);
    if (offset == StringPiece::npos) {
      offset = proto_file_list.length();
    }

    StringPiece proto_file = proto_file_list.substr(start, offset - start);
    TrimWhitespace(&proto_file);
    if (proto_file.size() != 0) {
      std::map<string, string>::iterator existing_entry =
          map_->find(string(proto_file));
      if (existing_entry != map_->end()) {
        std::cerr << "warning: duplicate proto file reference, replacing "
                     "framework entry for '"
                  << string(proto_file) << "' with '" << string(framework_name)
                  << "' (was '" << existing_entry->second << "')." << std::endl;
        std::cerr.flush();
      }

      if (proto_file.find(' ') != StringPiece::npos) {
        std::cerr << "note: framework mapping file had a proto file with a "
                     "space in, hopefully that isn't a missing comma: '"
                  << string(proto_file) << "'" << std::endl;
        std::cerr.flush();
      }

      (*map_)[string(proto_file)] = string(framework_name);
    }

    start = offset + 1;
  }

  return true;
}